

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::ArrayPtr<char_const>>(char *target,ArrayPtr<const_char> *first)

{
  char *pcVar1;
  char *end;
  char *i;
  ArrayPtr<const_char> *first_local;
  char *target_local;
  
  end = ArrayPtr<const_char>::begin(first);
  pcVar1 = ArrayPtr<const_char>::end(first);
  first_local = (ArrayPtr<const_char> *)target;
  while (end != pcVar1) {
    *(char *)&first_local->ptr = *end;
    end = end + 1;
    first_local = (ArrayPtr<const_char> *)((long)&first_local->ptr + 1);
  }
  pcVar1 = fill((char *)first_local);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}